

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::operator=(QString *this,QChar ch)

{
  long lVar1;
  QString *pQVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_ffffffffffffffd8;
  QString *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = assign(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                  (QChar)(char16_t)((ulong)in_RDI >> 0x30));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::operator=(QChar ch)
{
    return assign(1, ch);
}